

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O1

void __thiscall bitfoot::Bitfoot::AddPawnCaps<false,true>(Bitfoot *this,uint64_t dests)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  int iVar11;
  
  if ((dests != 0) && (this->pc[2] != 0)) {
    for (uVar9 = this->pc[2] << 7 & dests & this->pc[1] & 0x7f7f7f7f7f7f7f00; uVar9 != 0;
        uVar9 = uVar9 & uVar9 - 1) {
      lVar1 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      uVar7 = (&_board)[lVar1];
      uVar8 = (ulong)uVar7;
      if ((uVar7 & 1) == 0) {
        __assert_fail("_board[to] && (COLOR_OF(_board[to]) == !color)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0xb55,
                      "void bitfoot::Bitfoot::AddPawnCaps(const uint64_t) [color = false, under_promote = true]"
                     );
      }
      uVar2 = (uint)lVar1;
      uVar5 = uVar2 - 7;
      if (0x3f < uVar5) goto LAB_001175ef;
      uVar4 = (ulong)uVar5;
      if ((*(ulong *)(_BITMAP + uVar4 * 8) & this->pinned[0]) == 0) {
LAB_00117291:
        bVar10 = 0xb < uVar7 - 2;
        if (uVar2 < 0x38) {
          if (bVar10 && uVar8 != 0) goto LAB_001175d0;
          iVar6 = *(int *)(_VALUE_OF + uVar8 * 4);
          iVar11 = 0;
        }
        else {
          if (bVar10 && uVar8 != 0) goto LAB_001175d0;
          AddMove<false,(bitfoot::MoveType)4>
                    (this,2,uVar5,uVar2,*(int *)(_VALUE_OF + uVar8 * 4) + 0x3cf,uVar7,10);
          uVar7 = (&_board)[lVar1];
          if (0xb < uVar7 - 2 && (ulong)uVar7 != 0) goto LAB_001175d0;
          AddMove<false,(bitfoot::MoveType)4>
                    (this,2,uVar5,uVar2,*(int *)(_VALUE_OF + (ulong)uVar7 * 4) + 500,uVar7,8);
          uVar7 = (&_board)[lVar1];
          if (0xb < uVar7 - 2 && (ulong)uVar7 != 0) goto LAB_001175d0;
          AddMove<false,(bitfoot::MoveType)4>
                    (this,2,uVar5,uVar2,*(int *)(_VALUE_OF + (ulong)uVar7 * 4) + 0x140,uVar7,6);
          uVar7 = (&_board)[lVar1];
          if (0xb < uVar7 - 2 && (ulong)uVar7 != 0) goto LAB_001175d0;
          iVar6 = *(int *)(_VALUE_OF + (ulong)uVar7 * 4) + 300;
          iVar11 = 4;
        }
        AddMove<false,(bitfoot::MoveType)4>(this,2,uVar5,uVar2,iVar6,uVar7,iVar11);
      }
      else if ((*(ulong *)(_BITMAP + lVar1 * 8) & this->pinned[0]) != 0) {
        iVar6 = 0;
        if ((this->king[0] | uVar5) < 0x40) {
          iVar6 = *(int *)(uVar4 * 0x100 + 0x1b2660 + (ulong)(uint)this->king[0] * 4);
        }
        iVar11 = -iVar6;
        if (0 < iVar6) {
          iVar11 = iVar6;
        }
        iVar6 = *(int *)(uVar4 * 0x100 + 0x1b2660 + lVar1 * 4);
        iVar3 = -iVar6;
        if (0 < iVar6) {
          iVar3 = iVar6;
        }
        if (iVar11 == iVar3) goto LAB_00117291;
      }
    }
    for (uVar9 = dests & this->pc[2] << 9 & this->pc[1] & 0xfefefefefefefe00; uVar9 != 0;
        uVar9 = uVar9 & uVar9 - 1) {
      lVar1 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      uVar7 = (&_board)[lVar1];
      uVar8 = (ulong)uVar7;
      if ((uVar7 & 1) == 0) {
        __assert_fail("_board[to] && (COLOR_OF(_board[to]) == !color)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0xb76,
                      "void bitfoot::Bitfoot::AddPawnCaps(const uint64_t) [color = false, under_promote = true]"
                     );
      }
      uVar2 = (uint)lVar1;
      uVar5 = uVar2 - 9;
      if (0x3f < uVar5) {
LAB_001175ef:
        __assert_fail("IS_SQUARE(from)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0x2dd,
                      "bool bitfoot::Bitfoot::Pinned(const int, const int) const [color = false]");
      }
      uVar4 = (ulong)uVar5;
      if ((*(ulong *)(_BITMAP + uVar4 * 8) & this->pinned[0]) == 0) {
LAB_0011748c:
        bVar10 = 0xb < uVar7 - 2;
        if (uVar2 < 0x38) {
          if (bVar10 && uVar8 != 0) goto LAB_001175d0;
          iVar6 = *(int *)(_VALUE_OF + uVar8 * 4);
          iVar11 = 0;
        }
        else {
          if (bVar10 && uVar8 != 0) {
LAB_001175d0:
            __assert_fail("!piece || IS_PIECE(piece)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                          ,0xff,"static int bitfoot::Bitfoot::ValueOf(const int)");
          }
          AddMove<false,(bitfoot::MoveType)4>
                    (this,2,uVar5,uVar2,*(int *)(_VALUE_OF + uVar8 * 4) + 0x3cf,uVar7,10);
          uVar7 = (&_board)[lVar1];
          if (0xb < uVar7 - 2 && (ulong)uVar7 != 0) goto LAB_001175d0;
          AddMove<false,(bitfoot::MoveType)4>
                    (this,2,uVar5,uVar2,*(int *)(_VALUE_OF + (ulong)uVar7 * 4) + 500,uVar7,8);
          uVar7 = (&_board)[lVar1];
          if (0xb < uVar7 - 2 && (ulong)uVar7 != 0) goto LAB_001175d0;
          AddMove<false,(bitfoot::MoveType)4>
                    (this,2,uVar5,uVar2,*(int *)(_VALUE_OF + (ulong)uVar7 * 4) + 0x140,uVar7,6);
          uVar7 = (&_board)[lVar1];
          if (0xb < uVar7 - 2 && (ulong)uVar7 != 0) goto LAB_001175d0;
          iVar6 = *(int *)(_VALUE_OF + (ulong)uVar7 * 4) + 300;
          iVar11 = 4;
        }
        AddMove<false,(bitfoot::MoveType)4>(this,2,uVar5,uVar2,iVar6,uVar7,iVar11);
      }
      else if ((*(ulong *)(_BITMAP + lVar1 * 8) & this->pinned[0]) != 0) {
        iVar6 = 0;
        if ((this->king[0] | uVar5) < 0x40) {
          iVar6 = *(int *)(uVar4 * 0x100 + 0x1b2660 + (ulong)(uint)this->king[0] * 4);
        }
        iVar11 = -iVar6;
        if (0 < iVar6) {
          iVar11 = iVar6;
        }
        iVar6 = *(int *)(uVar4 * 0x100 + 0x1b2660 + lVar1 * 4);
        iVar3 = -iVar6;
        if (0 < iVar6) {
          iVar3 = iVar6;
        }
        if (iVar11 == iVar3) goto LAB_0011748c;
      }
    }
  }
  return;
}

Assistant:

inline void AddPawnCaps(const uint64_t dests) {
    if (!dests || !pc[color|Pawn]) {
      return;
    }

    uint64_t dest;
    int from;
    int to;

    if (color) {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[0]) >> 9) & pc[!color]);
    }
    else {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[0]) << 7) & pc[!color]);
    }
    while (dest) {
      from = (PopLowSquare(dest, to) + (color ? NorthEast : SouthEast));
      assert(_board[to] && (COLOR_OF(_board[to]) == !color));
      if (!Pinned<color>(from, to)) {
        if (BIT(to) & _RANK[color ? 0 : 7]) {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      (ValueOf(_board[to]) + QueenValue),
                                      _board[to], (color|Queen));
          if (under_promote) {
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + RookValue),
                                        _board[to], (color|Rook));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + BishopValue),
                                        _board[to], (color|Bishop));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + KnightValue),
                                        _board[to], (color|Knight));
          }
        }
        else {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      ValueOf(_board[to]), _board[to], 0);
        }
      }
    }

    if (color) {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[7]) >> 7) & pc[!color]);
    }
    else {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[7]) << 9) & pc[!color]);
    }
    while (dest) {
      from = (PopLowSquare(dest, to) + (color ? NorthWest : SouthWest));
      assert(_board[to] && (COLOR_OF(_board[to]) == !color));
      if (!Pinned<color>(from, to)) {
        if (BIT(to) & _RANK[color ? 0 : 7]) {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      (ValueOf(_board[to]) + QueenValue),
                                      _board[to], (color|Queen));
          if (under_promote) {
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + RookValue),
                                        _board[to], (color|Rook));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + BishopValue),
                                        _board[to], (color|Bishop));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + KnightValue),
                                        _board[to], (color|Knight));
          }
        }
        else {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      ValueOf(_board[to]), _board[to], 0);
        }
      }
    }
  }